

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::relative(path *__return_storage_ptr__,path *p,path *base)

{
  path local_50;
  path local_30;
  
  weakly_canonical(&local_30,p);
  weakly_canonical(&local_50,base);
  path::lexically_relative(__return_storage_ptr__,&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._path._M_dataplus._M_p != &local_50._path.field_2) {
    operator_delete(local_50._path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._path._M_dataplus._M_p != &local_30._path.field_2) {
    operator_delete(local_30._path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path relative(const path& p, const path& base)
{
    return weakly_canonical(p).lexically_relative(weakly_canonical(base));
}